

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

bool __thiscall
iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>::
CheckElem<int,iutest::detail::LeMatcher<int>>
          (PairMatcher<iutest::detail::LeMatcher<int>,int> *this,int *actual,LeMatcher<int> *matcher
          )

{
  bool bVar1;
  LeMatcher<int> *this_00;
  AssertionResult local_48;
  LeMatcher<int> *local_20;
  LeMatcher<int> *matcher_local;
  int *actual_local;
  PairMatcher<iutest::detail::LeMatcher<int>,_int> *this_local;
  
  local_20 = matcher;
  matcher_local = (LeMatcher<int> *)actual;
  actual_local = (int *)this;
  this_00 = CastToMatcher<iutest::detail::LeMatcher<int>>
                      (matcher,(type **)&iutest_type_traits::enabler_t<void>::value);
  LeMatcher<int>::operator()(&local_48,this_00,(int *)matcher_local);
  bVar1 = AssertionResult::operator_cast_to_bool(&local_48);
  AssertionResult::~AssertionResult(&local_48);
  return bVar1;
}

Assistant:

bool CheckElem(const T& actual, U& matcher)
    {
        return static_cast<bool>(CastToMatcher(matcher)(actual));
    }